

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_file_handle_parse_cmp_func
               (fdb_file_handle *fhandle,size_t n_func,char **kvs_names,
               fdb_custom_cmp_variable *functions,void **user_params)

{
  void *pvVar1;
  undefined8 *puVar2;
  size_t sVar3;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  cmp_func_node *node;
  uint64_t i;
  ulong local_30;
  
  if (((in_RSI != 0) && (in_RDX != 0)) && (in_RCX != 0)) {
    pvVar1 = calloc(1,0x10);
    *(void **)(in_RDI + 0x10) = pvVar1;
    list_init(*(list **)(in_RDI + 0x10));
    for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
      puVar2 = (undefined8 *)calloc(1,0x28);
      if (*(long *)(in_RDX + local_30 * 8) == 0) {
        *puVar2 = 0;
      }
      else {
        sVar3 = strlen(*(char **)(in_RDX + local_30 * 8));
        pvVar1 = calloc(1,sVar3 + 1);
        *puVar2 = pvVar1;
        strcpy((char *)*puVar2,*(char **)(in_RDX + local_30 * 8));
      }
      puVar2[1] = *(undefined8 *)(in_RCX + local_30 * 8);
      if (in_R8 != 0) {
        puVar2[2] = *(undefined8 *)(in_R8 + local_30 * 8);
      }
      list_push_back(*(list **)(in_RDI + 0x10),(list_elem *)(puVar2 + 3));
    }
  }
  return;
}

Assistant:

void fdb_file_handle_parse_cmp_func(fdb_file_handle *fhandle,
                                    size_t n_func,
                                    char **kvs_names,
                                    fdb_custom_cmp_variable *functions,
                                    void **user_params)
{
    uint64_t i;
    struct cmp_func_node *node;

    if (n_func == 0 || !kvs_names || !functions) {
        return;
    }

    fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(fhandle->cmp_func_list);

    for (i=0;i<n_func;++i){
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        if (kvs_names[i]) {
            node->kvs_name = (char*)calloc(1, strlen(kvs_names[i])+1);
            strcpy(node->kvs_name, kvs_names[i]);
        } else {
            // NULL .. default KVS
            node->kvs_name = NULL;
        }
        node->func = functions[i];
        if (user_params) {
            node->user_param = user_params[i];
        }
        list_push_back(fhandle->cmp_func_list, &node->le);
    }
}